

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void Assimp::insertMorphTimeValue
               (vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *values,
               float time,float weight,uint value)

{
  pointer *ppkVar1;
  pointer pMVar2;
  pointer pMVar3;
  iterator __position;
  key kVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  key k;
  MorphTimeValues val;
  key local_38;
  undefined1 local_30 [8];
  pointer local_28;
  pointer pkStack_20;
  pointer local_18;
  
  pMVar2 = (values->
           super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (values->
           super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pMVar3 - (long)pMVar2;
  local_38.mWeight = weight;
  local_38.mValue = value;
  local_30._0_4_ = time;
  if ((lVar5 == 0) || (time < pMVar2->mTime)) {
    local_28 = (pointer)0x0;
    pkStack_20 = (pointer)0x0;
    local_18 = (pointer)0x0;
    std::vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>::
    _M_realloc_insert<Assimp::MorphTimeValues::key_const&>
              ((vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>> *)
               &local_28,(iterator)0x0,&local_38);
    std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
              (values,(values->
                      super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                      )._M_impl.super__Vector_impl_data._M_start,(value_type *)local_30);
  }
  else {
    pMVar3 = pMVar3 + -1;
    if (time < pMVar3->mTime || time == pMVar3->mTime) {
      uVar6 = 1;
      uVar7 = 0;
      while( true ) {
        if (ABS(time - pMVar2[uVar7].mTime) < 1e-06) {
          __position._M_current =
               *(pointer *)
                ((long)&pMVar2[uVar7].mKeys.
                        super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                        ._M_impl + 8);
          if (__position._M_current !=
              *(pointer *)
               ((long)&pMVar2[uVar7].mKeys.
                       super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                       ._M_impl + 0x10)) {
            kVar4.mValue = value;
            kVar4.mWeight = weight;
            *__position._M_current = kVar4;
            ppkVar1 = (pointer *)
                      ((long)&pMVar2[uVar7].mKeys.
                              super__Vector_base<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
                              ._M_impl + 8);
            *ppkVar1 = *ppkVar1 + 1;
            return;
          }
          std::vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>::
          _M_realloc_insert<Assimp::MorphTimeValues::key_const&>
                    ((vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>
                      *)&pMVar2[uVar7].mKeys,__position,&local_38);
          return;
        }
        uVar8 = (ulong)uVar6;
        if ((pMVar2[uVar7].mTime < time) && (time < pMVar2[uVar8].mTime)) break;
        uVar6 = uVar6 + 1;
        uVar7 = uVar8;
        if ((ulong)(lVar5 >> 5) <= uVar8) {
          return;
        }
      }
      local_28 = (pointer)0x0;
      pkStack_20 = (pointer)0x0;
      local_18 = (pointer)0x0;
      std::vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>::
      _M_realloc_insert<Assimp::MorphTimeValues::key_const&>
                ((vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>
                  *)&local_28,(iterator)0x0,&local_38);
      std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
                (values,(values->
                        super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar7,(value_type *)local_30);
    }
    else {
      local_28 = (pointer)0x0;
      pkStack_20 = (pointer)0x0;
      local_18 = (pointer)0x0;
      std::vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>::
      _M_realloc_insert<Assimp::MorphTimeValues::key_const&>
                ((vector<Assimp::MorphTimeValues::key,std::allocator<Assimp::MorphTimeValues::key>>
                  *)&local_28,(iterator)0x0,&local_38);
      std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::insert
                (values,(values->
                        super__Vector_base<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                        )._M_impl.super__Vector_impl_data._M_finish,(value_type *)local_30);
    }
  }
  if (local_28 != (pointer)0x0) {
    operator_delete(local_28);
  }
  return;
}

Assistant:

void insertMorphTimeValue(std::vector<MorphTimeValues> &values, float time, float weight, unsigned int value)
{
    MorphTimeValues::key k;
    k.mValue = value;
    k.mWeight = weight;
    if (values.size() == 0 || time < values[0].mTime)
    {
        MorphTimeValues val;
        val.mTime = time;
        val.mKeys.push_back(k);
        values.insert(values.begin(), val);
        return;
    }
    if (time > values.back().mTime)
    {
        MorphTimeValues val;
        val.mTime = time;
        val.mKeys.push_back(k);
        values.insert(values.end(), val);
        return;
    }
    for (unsigned int i = 0; i < values.size(); i++)
    {
        if (std::abs(time - values[i].mTime) < 1e-6f)
        {
            values[i].mKeys.push_back(k);
            return;
        }
        else if (time > values[i].mTime && time < values[i + 1].mTime)
        {
            MorphTimeValues val;
            val.mTime = time;
            val.mKeys.push_back(k);
            values.insert(values.begin() + i, val);
            return;
        }
    }
    // should not get here
}